

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish_test.cc
# Opt level: O2

void __thiscall Blowfish_CBC_Test::TestBody(Blowfish_CBC_Test *this)

{
  uint8_t *in;
  BlowfishTestCase *pBVar1;
  int iVar2;
  EVP_CIPHER *pEVar3;
  long lVar4;
  char *pcVar5;
  char *in_R9;
  BlowfishTestCase *key;
  ScopedTrace gtest_trace_103;
  AssertionResult gtest_ar__3;
  Bytes local_1d8;
  int out_bytes;
  AssertionResult gtest_ar_;
  AssertHelper local_1a0;
  int final_bytes;
  uint test_num;
  BlowfishTestCase *local_190;
  uint8_t out [24];
  ScopedEVP_CIPHER_CTX decrypt_ctx;
  ScopedEVP_CIPHER_CTX ctx;
  
  test_num = 0;
  lVar4 = 0xc0;
  key = kTests;
  while( true ) {
    if (lVar4 == 0) {
      return;
    }
    test_num = test_num + 1;
    testing::ScopedTrace::ScopedTrace<unsigned_int>
              (&gtest_trace_103,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
               ,0x67,&test_num);
    EVP_CIPHER_CTX_init((EVP_CIPHER_CTX *)&ctx);
    pEVar3 = EVP_bf_cbc();
    iVar2 = EVP_EncryptInit_ex((EVP_CIPHER_CTX *)&ctx,pEVar3,(ENGINE *)0x0,key->key,key->iv);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = iVar2 != 0;
    if (iVar2 == 0) break;
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    iVar2 = EVP_EncryptUpdate((EVP_CIPHER_CTX *)&ctx,out,&out_bytes,key->plaintext,0x10);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = iVar2 != 0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&gtest_ar__3);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&decrypt_ctx,(internal *)&gtest_ar_,
                 (AssertionResult *)
                 "EVP_EncryptUpdate(ctx.get(), out, &out_bytes, test.plaintext, sizeof(test.plaintext))"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1d8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x70,(char *)CONCAT71(decrypt_ctx.ctx_.cipher._1_7_,(char)decrypt_ctx.ctx_.cipher)
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&gtest_ar__3)
      ;
      goto LAB_0012059d;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    iVar2 = EVP_EncryptFinal_ex((EVP_CIPHER_CTX *)&ctx,out + out_bytes,&final_bytes);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = iVar2 != 0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&gtest_ar__3);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&decrypt_ctx,(internal *)&gtest_ar_,
                 (AssertionResult *)"EVP_EncryptFinal_ex(ctx.get(), out + out_bytes, &final_bytes)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x71,(char *)CONCAT71(decrypt_ctx.ctx_.cipher._1_7_,(char)decrypt_ctx.ctx_.cipher)
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&gtest_ar__3)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
      std::__cxx11::string::~string((string *)&decrypt_ctx);
      if (gtest_ar__3._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar__3._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    gtest_ar_._0_8_ = (long)final_bytes + (long)out_bytes;
    gtest_ar__3.success_ = true;
    gtest_ar__3._1_7_ = 0;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&decrypt_ctx,"static_cast<size_t>(out_bytes + final_bytes)",
               "sizeof(test.cbc_ciphertext)",(unsigned_long *)&gtest_ar_,
               (unsigned_long *)&gtest_ar__3);
    local_190 = key;
    if ((char)decrypt_ctx.ctx_.cipher == '\0') {
      testing::Message::Message((Message *)&gtest_ar_);
      pcVar5 = "";
      if (decrypt_ctx.ctx_.app_data != (void *)0x0) {
        pcVar5 = *decrypt_ctx.ctx_.app_data;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x73,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&gtest_ar_)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
      if (gtest_ar_._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&decrypt_ctx.ctx_.app_data);
    in = local_190->cbc_ciphertext;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x18;
    gtest_ar__3._0_8_ = out;
    gtest_ar__3.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x18;
    gtest_ar_._0_8_ = in;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)&decrypt_ctx,"Bytes(test.cbc_ciphertext)","Bytes(out)",
               (Bytes *)&gtest_ar_,(Bytes *)&gtest_ar__3);
    if ((char)decrypt_ctx.ctx_.cipher == '\0') {
      testing::Message::Message((Message *)&gtest_ar_);
      pcVar5 = "";
      if (decrypt_ctx.ctx_.app_data != (void *)0x0) {
        pcVar5 = *decrypt_ctx.ctx_.app_data;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__3,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x74,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3,(Message *)&gtest_ar_)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3);
      if (gtest_ar_._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&decrypt_ctx.ctx_.app_data);
    EVP_CIPHER_CTX_init((EVP_CIPHER_CTX *)&decrypt_ctx);
    pEVar3 = EVP_bf_cbc();
    iVar2 = EVP_DecryptInit_ex((EVP_CIPHER_CTX *)&decrypt_ctx,pEVar3,(ENGINE *)0x0,local_190->key,
                               key->iv);
    gtest_ar__3.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar__3.success_ = iVar2 != 0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&local_1d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_,(internal *)&gtest_ar__3,
                 (AssertionResult *)
                 "EVP_DecryptInit_ex(decrypt_ctx.get(), EVP_bf_cbc(), nullptr, test.key, test.iv)",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_1a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x78,(char *)gtest_ar_._0_8_);
      testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_1d8);
LAB_00120687:
      testing::internal::AssertHelper::~AssertHelper(&local_1a0);
      std::__cxx11::string::~string((string *)&gtest_ar_);
      if ((long *)local_1d8.span_.data_ != (long *)0x0) {
        (**(code **)(*(long *)local_1d8.span_.data_ + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__3.message_);
      bssl::internal::
      StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>::
      ~StackAllocated(&decrypt_ctx);
      goto LAB_001206c2;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__3.message_);
    iVar2 = EVP_DecryptUpdate((EVP_CIPHER_CTX *)&decrypt_ctx,out,&out_bytes,in,0x18);
    gtest_ar__3.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar__3.success_ = iVar2 != 0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&local_1d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_,(internal *)&gtest_ar__3,
                 (AssertionResult *)
                 "EVP_DecryptUpdate(decrypt_ctx.get(), out, &out_bytes, test.cbc_ciphertext, sizeof(test.cbc_ciphertext))"
                 ,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_1a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x7b,(char *)gtest_ar_._0_8_);
      testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_1d8);
      goto LAB_00120687;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__3.message_);
    iVar2 = EVP_DecryptFinal_ex((EVP_CIPHER_CTX *)&decrypt_ctx,out + out_bytes,&final_bytes);
    pBVar1 = local_190;
    gtest_ar__3.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar__3.success_ = iVar2 != 0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&local_1d8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_,(internal *)&gtest_ar__3,
                 (AssertionResult *)
                 "EVP_DecryptFinal_ex(decrypt_ctx.get(), out + out_bytes, &final_bytes)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_1a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x7d,(char *)gtest_ar_._0_8_);
      testing::internal::AssertHelper::operator=(&local_1a0,(Message *)&local_1d8);
      testing::internal::AssertHelper::~AssertHelper(&local_1a0);
      std::__cxx11::string::~string((string *)&gtest_ar_);
      if ((long *)local_1d8.span_.data_ != (long *)0x0) {
        (**(code **)(*(long *)local_1d8.span_.data_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__3.message_);
    gtest_ar__3._0_8_ = (long)final_bytes + (long)out_bytes;
    local_1d8.span_.data_ = &DAT_00000010;
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)&gtest_ar_,"static_cast<size_t>(out_bytes + final_bytes)",
               "sizeof(test.plaintext)",(unsigned_long *)&gtest_ar__3,(unsigned_long *)&local_1d8);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar__3);
      pcVar5 = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar5 = *(char **)gtest_ar_.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x7f,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&gtest_ar__3)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
      if (gtest_ar__3._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar__3._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    gtest_ar__3.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x10;
    local_1d8.span_.size_ = (long)final_bytes + (long)out_bytes;
    local_1d8.span_.data_ = out;
    gtest_ar__3._0_8_ = key->plaintext;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)&gtest_ar_,"Bytes(test.plaintext)","Bytes(out, out_bytes + final_bytes)",
               (Bytes *)&gtest_ar__3,&local_1d8);
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar__3);
      pcVar5 = "";
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar5 = *(char **)gtest_ar_.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_1d8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
                 ,0x80,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&gtest_ar__3)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
      if (gtest_ar__3._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar__3._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    bssl::internal::
    StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>::
    ~StackAllocated(&decrypt_ctx);
    bssl::internal::
    StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>::
    ~StackAllocated((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                     *)&ctx);
    testing::ScopedTrace::~ScopedTrace(&gtest_trace_103);
    lVar4 = lVar4 + -0x60;
    key = pBVar1 + 1;
  }
  testing::Message::Message((Message *)&gtest_ar__3);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((string *)&decrypt_ctx,(internal *)&gtest_ar_,
             (AssertionResult *)
             "EVP_EncryptInit_ex(ctx.get(), EVP_bf_cbc(), nullptr, test.key, test.iv)","false",
             "true",in_R9);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_1d8,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/decrepit/blowfish/blowfish_test.cc"
             ,0x6e,(char *)CONCAT71(decrypt_ctx.ctx_.cipher._1_7_,(char)decrypt_ctx.ctx_.cipher));
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&gtest_ar__3);
LAB_0012059d:
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
  std::__cxx11::string::~string((string *)&decrypt_ctx);
  if (gtest_ar__3._0_8_ != 0) {
    (**(code **)(*(long *)gtest_ar__3._0_8_ + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
LAB_001206c2:
  bssl::internal::
  StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>::
  ~StackAllocated(&ctx);
  testing::ScopedTrace::~ScopedTrace(&gtest_trace_103);
  return;
}

Assistant:

TEST(Blowfish, CBC) {
  unsigned test_num = 0;
  for (const auto &test : kTests) {
    test_num++;
    SCOPED_TRACE(test_num);

    uint8_t out[sizeof(test.cbc_ciphertext)];
    int out_bytes, final_bytes;

    bssl::ScopedEVP_CIPHER_CTX ctx;
    ASSERT_TRUE(EVP_EncryptInit_ex(ctx.get(), EVP_bf_cbc(), nullptr, test.key,
                                   test.iv));
    ASSERT_TRUE(EVP_EncryptUpdate(ctx.get(), out, &out_bytes, test.plaintext,
                                  sizeof(test.plaintext)));
    EXPECT_TRUE(EVP_EncryptFinal_ex(ctx.get(), out + out_bytes, &final_bytes));
    EXPECT_EQ(static_cast<size_t>(out_bytes + final_bytes),
              sizeof(test.cbc_ciphertext));
    EXPECT_EQ(Bytes(test.cbc_ciphertext), Bytes(out));

    bssl::ScopedEVP_CIPHER_CTX decrypt_ctx;
    ASSERT_TRUE(EVP_DecryptInit_ex(decrypt_ctx.get(), EVP_bf_cbc(), nullptr,
                                   test.key, test.iv));
    ASSERT_TRUE(EVP_DecryptUpdate(decrypt_ctx.get(), out, &out_bytes,
                                  test.cbc_ciphertext,
                                  sizeof(test.cbc_ciphertext)));
    EXPECT_TRUE(
        EVP_DecryptFinal_ex(decrypt_ctx.get(), out + out_bytes, &final_bytes));
    EXPECT_EQ(static_cast<size_t>(out_bytes + final_bytes),
              sizeof(test.plaintext));
    EXPECT_EQ(Bytes(test.plaintext), Bytes(out, out_bytes + final_bytes));
  }
}